

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

string * benchmark::LocalDateTimeString_abi_cxx11_(void)

{
  bool in_DL;
  string *in_RDI;
  
  (anonymous_namespace)::DateTimeString_abi_cxx11_(in_RDI,(_anonymous_namespace_ *)0x1,in_DL);
  return in_RDI;
}

Assistant:

std::string LocalDateTimeString() {
  return DateTimeString(true);
}